

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char * read_file_from_fd(int fd,size_t *len)

{
  size_t sVar1;
  __off_t _Var2;
  ssize_t sVar3;
  char *text;
  size_t bytes_read;
  size_t *len_local;
  char *pcStack_10;
  int fd_local;
  
  sVar1 = lseek(fd,0,2);
  *len = sVar1;
  if (*len == 0xffffffffffffffff) {
    perror("lseek");
    pcStack_10 = (char *)0x0;
  }
  else {
    _Var2 = lseek(fd,0,0);
    if (_Var2 == -1) {
      perror("lseek");
      pcStack_10 = (char *)0x0;
    }
    else {
      pcStack_10 = (char *)malloc(*len + 1);
      if (pcStack_10 == (char *)0x0) {
        perror("malloc");
        pcStack_10 = (char *)0x0;
      }
      else {
        memset(pcStack_10,0,*len + 1);
        sVar3 = read(fd,pcStack_10,*len);
        if (sVar3 == -1) {
          perror("read");
          free(pcStack_10);
          pcStack_10 = (char *)0x0;
        }
        else {
          pcStack_10[*len] = '\0';
        }
      }
    }
  }
  return pcStack_10;
}

Assistant:

char *
read_file_from_fd (int fd, size_t *len)
{
  size_t bytes_read;
  char *text = NULL;
  *len = lseek (fd, 0, SEEK_END);

  if (unlikely (*len == -1))
    {
      perror ("lseek");
      return NULL;
    }

  if (unlikely (lseek (fd, 0, SEEK_SET) == -1))
    {
      perror ("lseek");
      return NULL;
    }

  text = malloc (*len + 1);
  if (unlikely (text == NULL))
    {
      perror ("malloc");
      return NULL;
    }
  memset (text, 0, *len + 1);

  if (read (fd, text, *len) == -1)
    {
      perror ("read");
      free (text);
      return NULL;
    }

  text[*len] = '\0';

  return text;
}